

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O2

void __thiscall BayesianGameBase::ChangeNrTypes(BayesianGameBase *this,Index agI,size_t new_nr)

{
  reference pvVar1;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                     (&this->_m_nrTypes,(ulong)agI);
  *pvVar1 = new_nr;
  Initialize(this);
  return;
}

Assistant:

void BayesianGameBase::ChangeNrTypes(Index agI, size_t new_nr)
{
    _m_nrTypes.at(agI) = new_nr;
    Initialize();
}